

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

void __thiscall Fl_Preferences::Node::set(Node *this,char *name,char *value)

{
  int iVar1;
  Entry *__ptr;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  
  uVar5 = this->nEntry_;
  __ptr = this->entry_;
  uVar4 = 0;
  uVar3 = 0;
  if (0 < (int)uVar5) {
    uVar3 = (ulong)uVar5;
  }
  lVar6 = 8;
  while( true ) {
    if (uVar3 == uVar4) {
      if (this->NEntry_ == uVar5) {
        iVar1 = 10;
        if (uVar5 != 0) {
          iVar1 = uVar5 * 2;
        }
        this->NEntry_ = iVar1;
        __ptr = (Entry *)realloc(__ptr,(long)iVar1 << 4);
        this->entry_ = __ptr;
        uVar5 = this->nEntry_;
      }
      pcVar2 = strdup(name);
      __ptr[(int)uVar5].name = pcVar2;
      if (value == (char *)0x0) {
        pcVar2 = (char *)0x0;
      }
      else {
        pcVar2 = strdup(value);
      }
      __ptr[(int)uVar5].value = pcVar2;
      lastEntrySet = uVar5;
      this->nEntry_ = uVar5 + 1;
      this->field_0x30 = this->field_0x30 | 1;
      return;
    }
    iVar1 = strcmp(name,*(char **)((long)__ptr + lVar6 + -8));
    if (iVar1 == 0) break;
    uVar4 = uVar4 + 1;
    lVar6 = lVar6 + 0x10;
  }
  if (value == (char *)0x0) {
    return;
  }
  pcVar2 = *(char **)((long)&__ptr->name + lVar6);
  iVar1 = strcmp(value,pcVar2);
  if (iVar1 != 0) {
    free(pcVar2);
    pcVar2 = strdup(value);
    *(char **)((long)&this->entry_->name + lVar6) = pcVar2;
    this->field_0x30 = this->field_0x30 | 1;
  }
  lastEntrySet = (int)uVar4;
  return;
}

Assistant:

void Fl_Preferences::Node::set( const char *name, const char *value )
{
  for ( int i=0; i<nEntry_; i++ ) {
    if ( strcmp( name, entry_[i].name ) == 0 ) {
      if ( !value ) return; // annotation
      if ( strcmp( value, entry_[i].value ) != 0 ) {
	if ( entry_[i].value )
	  free( entry_[i].value );
	entry_[i].value = strdup( value );
	dirty_ = 1;
      }
      lastEntrySet = i;
      return;
    }
  }
  if ( NEntry_==nEntry_ ) {
    NEntry_ = NEntry_ ? NEntry_*2 : 10;
    entry_ = (Entry*)realloc( entry_, NEntry_ * sizeof(Entry) );
  }
  entry_[ nEntry_ ].name = strdup( name );
  entry_[ nEntry_ ].value = value?strdup( value ):0;
  lastEntrySet = nEntry_;
  nEntry_++;
  dirty_ = 1;
}